

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiMaterial **_dest,aiMaterial *src)

{
  aiMaterialProperty *rOther;
  undefined1 auVar1 [16];
  aiMaterial *this;
  ulong uVar2;
  aiMaterialProperty **ppaVar3;
  aiMaterialProperty *this_00;
  char *pcVar4;
  aiMaterialProperty *sprop;
  aiMaterialProperty *prop;
  uint i;
  aiMaterial *dest;
  aiMaterial *src_local;
  aiMaterial **_dest_local;
  
  if ((_dest != (aiMaterial **)0x0) && (src != (aiMaterial *)0x0)) {
    this = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this);
    *_dest = this;
    aiMaterial::Clear(this);
    if (this->mProperties != (aiMaterialProperty **)0x0) {
      operator_delete__(this->mProperties);
    }
    this->mNumAllocated = src->mNumAllocated;
    this->mNumProperties = src->mNumProperties;
    auVar1 = ZEXT416(this->mNumAllocated) * ZEXT816(8);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppaVar3 = (aiMaterialProperty **)operator_new__(uVar2);
    this->mProperties = ppaVar3;
    for (prop._0_4_ = 0; (uint)prop < this->mNumProperties; prop._0_4_ = (uint)prop + 1) {
      this_00 = (aiMaterialProperty *)operator_new(0x420);
      aiMaterialProperty::aiMaterialProperty(this_00);
      this->mProperties[(uint)prop] = this_00;
      rOther = src->mProperties[(uint)prop];
      this_00->mDataLength = rOther->mDataLength;
      pcVar4 = (char *)operator_new__((ulong)this_00->mDataLength);
      this_00->mData = pcVar4;
      memcpy(this_00->mData,rOther->mData,(ulong)this_00->mDataLength);
      this_00->mIndex = rOther->mIndex;
      this_00->mSemantic = rOther->mSemantic;
      aiString::operator=((aiString *)this_00,&rOther->mKey);
      this_00->mType = rOther->mType;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy (aiMaterial** _dest, const aiMaterial* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMaterial* dest = (aiMaterial*) ( *_dest = new aiMaterial() );

    dest->Clear();
    delete[] dest->mProperties;

    dest->mNumAllocated  =  src->mNumAllocated;
    dest->mNumProperties =  src->mNumProperties;
    dest->mProperties    =  new aiMaterialProperty* [dest->mNumAllocated];

    for (unsigned int i = 0; i < dest->mNumProperties;++i)
    {
        aiMaterialProperty* prop  = dest->mProperties[i] = new aiMaterialProperty();
        aiMaterialProperty* sprop = src->mProperties[i];

        prop->mDataLength = sprop->mDataLength;
        prop->mData = new char[prop->mDataLength];
        ::memcpy(prop->mData,sprop->mData,prop->mDataLength);

        prop->mIndex    = sprop->mIndex;
        prop->mSemantic = sprop->mSemantic;
        prop->mKey      = sprop->mKey;
        prop->mType     = sprop->mType;
    }
}